

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

char units::getMatchCharacter(char mchar)

{
  char mchar_local;
  char local_1;
  
  switch(mchar) {
  case '\"':
  case '\'':
  case '`':
  default:
    local_1 = mchar;
    break;
  case '(':
    local_1 = ')';
    break;
  case ')':
    local_1 = '(';
    break;
  case '<':
    local_1 = '>';
    break;
  case '>':
    local_1 = '<';
    break;
  case '[':
    local_1 = ']';
    break;
  case ']':
    local_1 = '[';
    break;
  case '{':
    local_1 = '}';
    break;
  case '}':
    local_1 = '{';
  }
  return local_1;
}

Assistant:

static char getMatchCharacter(char mchar)
{
    switch (mchar) {
        case '{':
            return '}';
        case '[':
            return ']';
        case '(':
            return ')';
        case '<':
            return '>';
        case '}':
            return '{';
        case ']':
            return '[';
        case ')':
            return '(';
        case '>':
            return '<';
        case '\'':
        case '"':
        case '`':
        default:
            return mchar;
    }
}